

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O2

Aig_Man_t * Saig_ManDupUnfoldConstrs(Aig_Man_t *pAig)

{
  long lVar1;
  void **ppvVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Aig_Man_t *pAVar9;
  char *pcVar10;
  Aig_Obj_t *pAVar11;
  Aig_Obj_t *p1;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  _func_int_varargs *Vec_PtrSortCompare;
  int i;
  Vec_Ptr_t *local_40;
  Vec_Ptr_t *local_38;
  
  p = Vec_PtrAlloc(pAig->nTruePos);
  p_00 = Vec_PtrAlloc(pAig->nTruePos);
  for (uVar13 = 0; (int)uVar13 < pAig->nTruePos; uVar13 = uVar13 + 1) {
    Vec_PtrEntry(pAig->vCos,uVar13);
    Vec_PtrSortCompare = (_func_int_varargs *)(ulong)uVar13;
    iVar3 = Saig_ManDetectConstr(pAig,uVar13,&local_38,&local_40);
    pVVar4 = local_38;
    if (iVar3 == 0) {
      Vec_PtrFreeP(&local_38);
      Vec_PtrFreeP(&local_40);
      goto LAB_00536ea9;
    }
    Vec_PtrSort(local_38,Vec_PtrSortCompare);
    pVVar5 = local_40;
    Vec_PtrSort(local_40,Vec_PtrSortCompare);
    Vec_PtrPush(p,pVVar4);
    Vec_PtrPush(p_00,pVVar5);
  }
  pVVar4 = (Vec_Ptr_t *)Vec_PtrEntry(p_00,0);
  iVar3 = p_00->nSize;
  iVar14 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
    iVar14 = 0;
  }
  for (; iVar3 != iVar14; iVar14 = iVar14 + 1) {
    pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(p_00,iVar14);
    if (pVVar5->nSize != 0) {
      pVVar4 = pVVar5;
    }
  }
  iVar14 = 0;
  do {
    if (iVar14 == iVar3) {
      pAVar9 = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
      pcVar10 = Abc_UtilStrsav(pAig->pName);
      pAVar9->pName = pcVar10;
      pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAVar9->pConst1;
      for (iVar3 = 0; iVar3 < pAig->vCis->nSize; iVar3 = iVar3 + 1) {
        pvVar6 = Vec_PtrEntry(pAig->vCis,iVar3);
        pAVar7 = Aig_ObjCreateCi(pAVar9);
        *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar7;
      }
      for (iVar3 = 0; iVar3 < pAig->vObjs->nSize; iVar3 = iVar3 + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar3);
        if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
          pAVar11 = Aig_ObjChild0Copy(pAVar7);
          p1 = Aig_ObjChild1Copy(pAVar7);
          pAVar11 = Aig_And(pAVar9,pAVar11,p1);
          (pAVar7->field_5).pData = pAVar11;
        }
      }
      iVar3 = p->nSize;
      iVar14 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; iVar14 != iVar3; iVar14 = iVar14 + 1) {
        pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(p,iVar14);
        pAVar7 = pAVar9->pConst1;
        for (i = 0; i < pVVar5->nSize; i = i + 1) {
          pvVar6 = Vec_PtrEntry(pVVar5,i);
          pAVar7 = Aig_And(pAVar9,pAVar7,
                           (Aig_Obj_t *)
                           ((ulong)((uint)pvVar6 & 1) ^
                            *(ulong *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x28) ^ 1));
        }
        Aig_ObjCreateCo(pAVar9,pAVar7);
      }
      iVar3 = pVVar4->nSize;
      pAVar9->nConstrs = iVar3;
      for (iVar14 = 0; iVar14 < iVar3; iVar14 = iVar14 + 1) {
        pvVar6 = Vec_PtrEntry(pVVar4,iVar14);
        Aig_ObjCreateCo(pAVar9,(Aig_Obj_t *)
                               ((ulong)((uint)pvVar6 & 1) ^
                               *(ulong *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x28)));
        iVar3 = pVVar4->nSize;
      }
      for (iVar3 = 0; iVar3 < pAig->nRegs; iVar3 = iVar3 + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar3);
        pAVar7 = Aig_ObjChild0Copy(pAVar7);
        Aig_ObjCreateCo(pAVar9,pAVar7);
      }
      Vec_VecFree((Vec_Vec_t *)p);
      Vec_VecFree((Vec_Vec_t *)p_00);
      Aig_ManSetRegNum(pAVar9,pAig->nRegs);
      Aig_ManCleanup(pAVar9);
      Aig_ManSeqCleanup(pAVar9);
      return pAVar9;
    }
    pvVar6 = Vec_PtrEntry(p_00,iVar14);
    pVVar5 = (Vec_Ptr_t *)Vec_PtrEntry(p,iVar14);
    if ((pVVar5->nSize != 1) ||
       (pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,0), pAVar7 != pAig->pConst1)) {
      uVar13 = pVVar4->nSize;
      if (uVar13 != *(uint *)((long)pvVar6 + 4)) {
LAB_00536e9d:
        puts("Collected constraints are not compatible.");
LAB_00536ea9:
        Vec_VecFree((Vec_Vec_t *)p);
        Vec_VecFree((Vec_Vec_t *)p_00);
        pAVar9 = Aig_ManDupDfs(pAig);
        return pAVar9;
      }
      uVar8 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        uVar8 = 0;
      }
      uVar12 = 0;
      while (uVar8 != uVar12) {
        ppvVar2 = pVVar4->pArray + uVar12;
        lVar1 = uVar12 * 8;
        uVar12 = uVar12 + 1;
        if (*ppvVar2 != *(void **)(*(long *)((long)pvVar6 + 8) + lVar1)) goto LAB_00536e9d;
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrs( Aig_Man_t * pAig )
{
    Vec_Ptr_t * vOutsAll, * vConsAll;
    Vec_Ptr_t * vOuts, * vCons, * vCons0;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pMiter, * pObj;
    int i, k, RetValue;
    // detect constraints for each output
    vOutsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    vConsAll = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    Saig_ManForEachPo( pAig, pObj, i )
    {
        RetValue = Saig_ManDetectConstr( pAig, i, &vOuts, &vCons );
        if ( RetValue == 0 )
        {
            Vec_PtrFreeP( &vOuts );
            Vec_PtrFreeP( &vCons );
            Vec_VecFree( (Vec_Vec_t *)vOutsAll );
            Vec_VecFree( (Vec_Vec_t *)vConsAll );
            return Aig_ManDupDfs( pAig );
        }
        Vec_PtrSort( vOuts, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrSort( vCons, (int (*)(void))Saig_ManDupCompare );
        Vec_PtrPush( vOutsAll, vOuts );
        Vec_PtrPush( vConsAll, vCons );
    }
    // check if constraints are compatible
    vCons0 = (Vec_Ptr_t *)Vec_PtrEntry( vConsAll, 0 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
        if ( Vec_PtrSize(vCons) )
            vCons0 = vCons;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vConsAll, vCons, i )
    {
        // Constant 0 outputs are always compatible (vOuts stores the negation)
        vOuts = (Vec_Ptr_t *)Vec_PtrEntry( vOutsAll, i );
        if ( Vec_PtrSize(vOuts) == 1 && (Aig_Obj_t *)Vec_PtrEntry( vOuts, 0 ) == Aig_ManConst1(pAig) )
            continue;
        if ( !Vec_PtrEqual(vCons0, vCons) )
            break;
    }
    if ( i < Vec_PtrSize(vConsAll) )
    {
        printf( "Collected constraints are not compatible.\n" );
        Vec_VecFree( (Vec_Vec_t *)vOutsAll );
        Vec_VecFree( (Vec_Vec_t *)vConsAll );
        return Aig_ManDupDfs( pAig );
    }

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // transform each output
    Vec_PtrForEachEntry( Vec_Ptr_t *, vOutsAll, vOuts, i )
    {
        // AND the outputs
        pMiter = Aig_ManConst1( pAigNew );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOuts, pObj, k )
            pMiter = Aig_And( pAigNew, pMiter, Aig_Not(Aig_ObjRealCopy(pObj)) );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // add constraints
    pAigNew->nConstrs = Vec_PtrSize(vCons0);
    Vec_PtrForEachEntry( Aig_Obj_t *, vCons0, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjRealCopy(pObj) );
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
//    Vec_PtrFreeP( &vOuts );
//    Vec_PtrFreeP( &vCons );
    Vec_VecFree( (Vec_Vec_t *)vOutsAll );
    Vec_VecFree( (Vec_Vec_t *)vConsAll );

    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSeqCleanup( pAigNew );
    return pAigNew;
}